

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

string * __thiscall
cmdline::parser::option_with_value<int>::full_description(option_with_value<int> *this,string *desc)

{
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool bVar1;
  int *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  allocator<char> local_c9;
  string local_c8 [48];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  __lhs = in_RDI;
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  cmdline::detail::readable_typename<int>();
  std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  bVar1 = (*(byte *)(in_RSI + 0x29) & 1) == 0;
  if (bVar1) {
    cmdline::detail::lexical_cast<std::__cxx11::string,int>(in_stack_fffffffffffffec8);
    std::operator+((char *)__lhs,in_RDI);
    std::operator+(__lhs,(char *)in_RDI);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
               (allocator<char> *)in_stack_ffffffffffffff00);
  }
  std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_c8);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  }
  else {
    std::allocator<char>::~allocator(&local_c9);
  }
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  return __lhs;
}

Assistant:

std::string full_description(const std::string& desc) {
            return desc + " (" + detail::readable_typename<T>() +
                   (need ? "" : " [=" + detail::lexical_cast<std::string>(def) + "]") + ")";
        }